

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-utf8.cc
# Opt level: O1

void anon_unknown.dwarf_11a24a::assert_is_valid_utf8
               (bool expected,int length,int cu0,int cu1,int cu2,int cu3)

{
  bool bVar1;
  int line;
  size_t s_length;
  undefined4 in_register_0000008c;
  char buf [4];
  AssertionResult gtest_ar_;
  char local_84;
  undefined1 local_83;
  undefined1 local_82;
  undefined1 local_81;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  int local_74;
  int local_70;
  int local_6c;
  internal local_68 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  AssertHelper local_58;
  string local_50;
  
  local_84 = (char)cu0;
  local_83 = (undefined1)cu1;
  local_82 = (undefined1)cu2;
  local_81 = (undefined1)cu3;
  local_74 = cu1;
  local_70 = cu2;
  local_6c = cu3;
  if (1 < length && expected) {
    s_length = 1;
    do {
      bVar1 = wabt::IsValidUtf8(&local_84,s_length);
      local_68[0] = (internal)!bVar1;
      local_60.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!(bool)local_68[0]) {
        testing::Message::Message((Message *)&local_80);
        std::ostream::operator<<((ostream *)(local_80.ptr_ + 0x10),cu0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_80.ptr_ + 0x10),", ",2)
        ;
        std::ostream::operator<<((ostream *)(local_80.ptr_ + 0x10),local_74);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_80.ptr_ + 0x10),", ",2)
        ;
        std::ostream::operator<<((ostream *)(local_80.ptr_ + 0x10),local_70);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_80.ptr_ + 0x10),", ",2)
        ;
        std::ostream::operator<<((ostream *)(local_80.ptr_ + 0x10),local_6c);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_50,local_68,(AssertionResult *)"IsValidUtf8(buf, bad_length)","true",
                   "false",(char *)CONCAT44(in_register_0000008c,cu3));
        line = 0x26;
        goto LAB_001fa0f1;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      s_length = s_length + 1;
    } while ((uint)length != s_length);
  }
  bVar1 = wabt::IsValidUtf8(&local_84,(ulong)(uint)length);
  local_68[0] = (internal)(bVar1 == expected);
  local_60.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_68[0]) {
    testing::Message::Message((Message *)&local_80);
    std::ostream::operator<<((ostream *)(local_80.ptr_ + 0x10),cu0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_80.ptr_ + 0x10),", ",2);
    std::ostream::operator<<((ostream *)(local_80.ptr_ + 0x10),local_74);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_80.ptr_ + 0x10),", ",2);
    std::ostream::operator<<((ostream *)(local_80.ptr_ + 0x10),local_70);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_80.ptr_ + 0x10),", ",2);
    std::ostream::operator<<((ostream *)(local_80.ptr_ + 0x10),local_6c);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_50,local_68,(AssertionResult *)"expected == IsValidUtf8(buf, length)","false",
               "true",(char *)CONCAT44(in_register_0000008c,cu3));
    line = 0x2b;
LAB_001fa0f1:
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-utf8.cc"
               ,line,local_50._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if (local_80.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_80.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_80.ptr_ + 8))();
      }
      local_80.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

void assert_is_valid_utf8(bool expected,
                          int length,
                          int cu0 = 0,
                          int cu1 = 0,
                          int cu2 = 0,
                          int cu3 = 0) {
  assert(length <= 4);
  char buf[4] = {static_cast<char>(cu0), static_cast<char>(cu1),
                 static_cast<char>(cu2), static_cast<char>(cu3)};
  if (expected) {
    // Make sure it fails if there are continuation bytes past the end of the
    // string.
    for (int bad_length = 1; bad_length < length; ++bad_length) {
      ASSERT_FALSE(IsValidUtf8(buf, bad_length))
          << cu0 << ", " << cu1 << ", " << cu2 << ", " << cu3;
    }
  }

  ASSERT_TRUE(expected == IsValidUtf8(buf, length))
      << cu0 << ", " << cu1 << ", " << cu2 << ", " << cu3;
}